

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3HashClear(Hash *pH)

{
  undefined4 *in_RDI;
  HashElem *next_elem;
  HashElem *elem;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 2);
  *(undefined8 *)(in_RDI + 2) = 0;
  sqlite3_free((void *)0x19c7f1);
  *(undefined8 *)(in_RDI + 4) = 0;
  *in_RDI = 0;
  while (local_10 != (undefined8 *)0x0) {
    local_10 = (undefined8 *)*local_10;
    sqlite3_free((void *)0x19c827);
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3HashClear(Hash *pH){
  HashElem *elem;         /* For looping over all elements of the table */

  assert( pH!=0 );
  elem = pH->first;
  pH->first = 0;
  sqlite3_free(pH->ht);
  pH->ht = 0;
  pH->htsize = 0;
  while( elem ){
    HashElem *next_elem = elem->next;
    sqlite3_free(elem);
    elem = next_elem;
  }
  pH->count = 0;
}